

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O0

void saveToFile(int **mrx,int height,int width,char *filename)

{
  FILE *__stream;
  int local_30;
  int local_2c;
  int j;
  int i;
  FILE *file;
  char *filename_local;
  int width_local;
  int height_local;
  int **mrx_local;
  
  __stream = fopen(filename,"w");
  for (local_2c = 0; local_2c < height; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < width; local_30 = local_30 + 1) {
      fprintf(__stream,"%3d,",(ulong)(uint)mrx[local_2c][local_30]);
    }
    fprintf(__stream,"\n");
  }
  fclose(__stream);
  return;
}

Assistant:

void saveToFile(int **mrx, const int height, const int width, const char *filename) {
    FILE *file = fopen(filename, "w");
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            fprintf(file, "%3d,", mrx[i][j]);
        }
        fprintf(file, "\n");
    }
    fclose(file);
}